

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

short mixtype(obj *o1,obj *o2)

{
  uint uVar1;
  int iVar2;
  uint local_3c;
  uint local_34;
  uint local_30;
  int result;
  int i2;
  int i1;
  obj *swp;
  obj *o2_local;
  obj *o1_local;
  
  swp = o2;
  o2_local = o1;
  if ((o1->oclass == '\b') && (o2->otyp == 0x140)) {
    swp = o1;
    o2_local = o2;
  }
  if (o2_local->otyp == 0x140) {
    if (swp->otyp == 0x150) {
      return 0x150;
    }
    if (swp->otyp == 0x151) {
      return 0x151;
    }
  }
  if (o2_local->oclass == '\b') {
    alchemy_init();
    result = (int)alchemy_table1[o2_local->otyp + -0x12a];
    uVar1 = (uint)alchemy_table1[swp->otyp + -0x12a];
    if ((result < 0) || ((int)uVar1 < 0)) {
      return 0;
    }
    if ((uVar1 == 0) || ((local_30 = uVar1, uVar1 == 8 && (result != 0)))) {
      local_30 = result;
      result = uVar1;
    }
    if ((result == 0) && (local_30 == 8)) {
      return alchemy_table2[0x10];
    }
    if (((((result & 7U) == 1) || (((result & 7U) == 2 || ((result & 7U) == 4)))) &&
        (((local_30 & 7) == 1 || (((local_30 & 7) == 2 || ((local_30 & 7) == 4)))))) ||
       ((((result & 7U) == 3 || (((result & 7U) == 5 || ((result & 7U) == 6)))) &&
        (((local_30 & 7) == 3 || (((local_30 & 7) == 5 || ((local_30 & 7) == 6)))))))) {
      local_34 = result | local_30;
      if (((result ^ local_30) & 8) != 0) {
        if ((*(uint *)&o2_local->field_0x4a >> 8 & 3) == (*(uint *)&swp->field_0x4a >> 8 & 3)) {
          iVar2 = rn2(2);
          local_3c = iVar2 << 3;
        }
        else {
          if ((*(uint *)&o2_local->field_0x4a >> 8 & 3) == 0) {
            local_3c = local_30;
          }
          else {
            local_3c = result;
          }
          local_3c = local_3c & 8;
        }
        local_34 = local_3c ^ local_34;
      }
    }
    else {
      if (((result != 0) || ((local_30 & 8) == 0)) && ((result != 8 || ((local_30 & 8) != 0)))) {
        return 0;
      }
      local_34 = local_30 ^ 8;
    }
    if (obj_descr[objects[alchemy_table2[(int)local_34]].oc_name_idx].oc_name == (char *)0x0) {
      return 0;
    }
    return alchemy_table2[(int)local_34];
  }
  if (o2_local->otyp == 0x10a) {
    iVar2 = (int)swp->otyp;
    if ((iVar2 != 0x12d) && (1 < iVar2 - 0x133U)) {
      if (iVar2 == 0x13f) {
        return 0x140;
      }
      if (1 < iVar2 - 0x150U) goto LAB_002a1ade;
    }
    o1_local._6_2_ = 0x14f;
  }
  else {
    if ((o2_local->otyp == 0x200) && (swp->otyp == 0x13e)) {
      return 0x140;
    }
LAB_002a1ade:
    o1_local._6_2_ = 0;
  }
  return o1_local._6_2_;
}

Assistant:

static short mixtype(struct obj *o1, struct obj *o2)
{
	/* cut down on the number of cases below */
	if (o1->oclass == POTION_CLASS && o2->otyp == POT_FRUIT_JUICE) {
		struct obj *swp;

		swp = o1; o1 = o2; o2 = swp;
	}

	switch (o1->otyp) {
	    case POT_FRUIT_JUICE:
		switch (o2->otyp) {
		    case POT_BLOOD:
			return POT_BLOOD;
		    case POT_VAMPIRE_BLOOD:
			return POT_VAMPIRE_BLOOD;
		}
		break;
	}

	if (o1->oclass == POTION_CLASS) {
	    int i1, i2, result;

	    alchemy_init();
	    i1 = alchemy_table1[o1->otyp - POT_GAIN_ABILITY];
	    i2 = alchemy_table1[o2->otyp - POT_GAIN_ABILITY];

	    /* check that both potions are of mixable types */
	    if (i1 < 0 || i2 < 0)
		return 0;

	    /* swap for simplified checks */
	    if (i2 == ALCHEMY_WHITE || (i2 == ALCHEMY_BLACK && i1 != ALCHEMY_WHITE)) {
		result = i1;
		i1 = i2;
		i2 = result;
	    }

	    if (i1 == ALCHEMY_WHITE && i2 == ALCHEMY_BLACK) {
		return ALCHEMY_GRAY;
	    } else if ((IS_PRIMARY_COLOR(i1) && IS_PRIMARY_COLOR(i2)) ||
		       (IS_SECONDARY_COLOR(i1) && IS_SECONDARY_COLOR(i2))) {
		/* bitwise OR simulates pigment addition */
		result = i1 | i2;
		/* adjust light/dark level if necessary */
		if ((i1 ^ i2) & 8) {
		    if (o1->odiluted == o2->odiluted) {
			/* same dilution level, randomly toggle */
			result ^= (rn2(2) << 3);
		    } else {
			/* use dark/light level of undiluted potion */
			result ^= (o1->odiluted ? i1 : i2) & 8;
		    }
		}
	    } else if ((i1 == ALCHEMY_WHITE && IS_DARK_COLOR(i2)) ||
		       (i1 == ALCHEMY_BLACK && IS_LIGHT_COLOR(i2))) {
		/* toggle light/dark bit */
		result = i2 ^ 8;
	    } else {
		return 0;
	    }

	    /* don't create non-existing potions */
	    if (OBJ_NAME(objects[alchemy_table2[result]]) == 0)
		return 0;

	    return alchemy_table2[result];
	} else {
	    switch (o1->otyp) {
		case UNICORN_HORN:
		    switch (o2->otyp) {
			case POT_SICKNESS:
			    return POT_FRUIT_JUICE;
			case POT_HALLUCINATION:
			case POT_BLINDNESS:
			case POT_CONFUSION:
			case POT_BLOOD:
			case POT_VAMPIRE_BLOOD:
			    return POT_WATER;
		    }
		    break;
		case AMETHYST:	/* "a-methyst" == "not intoxicated" */
		    if (o2->otyp == POT_BOOZE)
			return POT_FRUIT_JUICE;
		    break;
		}
	}

	return 0;
}